

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

int compute_codewords(Codebook *c,uint8 *len,int n,uint32 *values)

{
  uint n_00;
  int iVar1;
  Codebook *c_00;
  uint huff_code;
  uint32 *in_RCX;
  int in_EDX;
  long in_RSI;
  Codebook *in_RDI;
  bool bVar2;
  int y;
  int z;
  uint32 res;
  uint32 available [32];
  int m;
  int k;
  int i;
  uint local_c4;
  uint local_c0;
  uint local_b8 [33];
  int local_34;
  int local_30;
  int local_2c;
  uint32 *local_28;
  int local_1c;
  long local_18;
  Codebook *local_10;
  
  local_34 = 0;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(local_b8,0,0x80);
  iVar1 = local_34;
  for (local_30 = 0; (local_30 < local_1c && (*(char *)(local_18 + local_30) == -1));
      local_30 = local_30 + 1) {
  }
  if (local_30 != local_1c) {
    local_34 = local_34 + 1;
    add_entry(local_10,0,local_30,iVar1,(uint)*(byte *)(local_18 + local_30),local_28);
    for (local_2c = 1; local_2c <= (int)(uint)*(byte *)(local_18 + local_30);
        local_2c = local_2c + 1) {
      local_b8[local_2c] = 1 << (0x20U - (char)local_2c & 0x1f);
    }
    for (local_2c = local_30 + 1; local_2c < local_1c; local_2c = local_2c + 1) {
      local_c0 = (uint)*(byte *)(local_18 + local_2c);
      if (local_c0 != 0xff) {
        while( true ) {
          bVar2 = false;
          if (0 < (int)local_c0) {
            bVar2 = local_b8[(int)local_c0] == 0;
          }
          if (!bVar2) break;
          local_c0 = local_c0 - 1;
        }
        if (local_c0 == 0) {
          return 0;
        }
        n_00 = local_b8[(int)local_c0];
        local_b8[(int)local_c0] = 0;
        c_00 = local_10;
        huff_code = bit_reverse(n_00);
        iVar1 = local_34;
        local_34 = local_34 + 1;
        add_entry(c_00,huff_code,local_2c,iVar1,(uint)*(byte *)(local_18 + local_2c),local_28);
        if (local_c0 != *(byte *)(local_18 + local_2c)) {
          for (local_c4 = (uint)*(byte *)(local_18 + local_2c); (int)local_c0 < (int)local_c4;
              local_c4 = local_c4 - 1) {
            local_b8[(int)local_c4] = n_00 + (1 << (0x20U - (char)local_c4 & 0x1f));
          }
        }
      }
    }
  }
  return 1;
}

Assistant:

static int compute_codewords(Codebook *c, uint8 *len, int n, uint32 *values)
{
   int i,k,m=0;
   uint32 available[32];

   memset(available, 0, sizeof(available));
   // find the first entry
   for (k=0; k < n; ++k) if (len[k] < NO_CODE) break;
   if (k == n) { assert(c->sorted_entries == 0); return TRUE; }
   assert(len[k] < 32); // no error return required, code reading lens checks this
   // add to the list
   add_entry(c, 0, k, m++, len[k], values);
   // add all available leaves
   for (i=1; i <= len[k]; ++i)
      available[i] = 1U << (32-i);
   // note that the above code treats the first case specially,
   // but it's really the same as the following code, so they
   // could probably be combined (except the initial code is 0,
   // and I use 0 in available[] to mean 'empty')
   for (i=k+1; i < n; ++i) {
      uint32 res;
      int z = len[i], y;
      if (z == NO_CODE) continue;
      assert(z < 32); // no error return required, code reading lens checks this
      // find lowest available leaf (should always be earliest,
      // which is what the specification calls for)
      // note that this property, and the fact we can never have
      // more than one free leaf at a given level, isn't totally
      // trivial to prove, but it seems true and the assert never
      // fires, so!
      while (z > 0 && !available[z]) --z;
      if (z == 0) { return FALSE; }
      res = available[z];
      available[z] = 0;
      add_entry(c, bit_reverse(res), i, m++, len[i], values);
      // propagate availability up the tree
      if (z != len[i]) {
         for (y=len[i]; y > z; --y) {
            assert(available[y] == 0);
            available[y] = res + (1 << (32-y));
         }
      }
   }
   return TRUE;
}